

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KillReceiver.cpp
# Opt level: O2

void __thiscall KillReceiver::KillReceiver(KillReceiver *this)

{
  int iVar1;
  string local_b0;
  sigset_t mask;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"KillReceiver",(allocator<char> *)&mask);
  Subscriber::Subscriber(&this->super_Subscriber,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_00158cb8;
  sigemptyset((sigset_t *)&mask);
  sigaddset((sigset_t *)&mask,2);
  iVar1 = sigprocmask(0,(sigset_t *)&mask,(sigset_t *)0x0);
  no_err(iVar1,"sigprocmask failed");
  iVar1 = signalfd(-1,(sigset_t *)&mask,0);
  Subscriber::set_fd(&this->super_Subscriber,iVar1);
  Subscriber::set_expected(&this->super_Subscriber,0x19);
  return;
}

Assistant:

KillReceiver::KillReceiver() : Subscriber("KillReceiver") {
    sigset_t mask;
    sigemptyset (&mask);
    sigaddset (&mask, SIGINT);
    no_err(sigprocmask(SIG_BLOCK, &mask, NULL), "sigprocmask failed");
    int fd = signalfd(-1, &mask, 0);
    set_fd(fd);
    set_expected(POLLIN | POLLERR | POLLHUP);
}